

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_attribute __thiscall
pugi::xml_node::insert_attribute_after(xml_node *this,char_t *name_,xml_attribute *attr)

{
  ulong uVar1;
  xml_node_struct *pxVar2;
  xml_allocator *this_00;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct *pxVar4;
  uint uVar5;
  xml_attribute_struct **ppxVar6;
  xml_attribute_struct *pxVar7;
  xml_attribute a;
  xml_attribute local_30;
  xml_attribute local_28;
  
  pxVar2 = this->_root;
  if (pxVar2 == (xml_node_struct *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)pxVar2->header & 0xf;
  }
  if (((uVar5 == 2) || (uVar5 == 7)) && (attr->_attr != (xml_attribute_struct *)0x0)) {
    ppxVar6 = &pxVar2->first_attribute;
    do {
      pxVar4 = *ppxVar6;
      if (pxVar4 == attr->_attr) break;
      ppxVar6 = &pxVar4->next_attribute;
    } while (pxVar4 != (xml_attribute_struct *)0x0);
    if (pxVar4 != (xml_attribute_struct *)0x0) {
      if (pxVar2 == (xml_node_struct *)0x0) {
        __assert_fail("object",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                      ,0x49b,
                      "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                     );
      }
      this_00 = *(xml_allocator **)((long)pxVar2 - (pxVar2->header >> 8));
      uVar1 = this_00->_busy_size + 0x28;
      if (uVar1 < 0x7fd9) {
        local_28._attr = (xml_attribute_struct *)this_00->_root;
        pxVar4 = (xml_attribute_struct *)
                 ((long)&((xml_memory_page *)local_28._attr)[1].allocator + this_00->_busy_size);
        this_00->_busy_size = uVar1;
      }
      else {
        pxVar4 = (xml_attribute_struct *)
                 impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                           (this_00,0x28,(xml_memory_page **)&local_28);
      }
      if (pxVar4 == (xml_attribute_struct *)0x0) {
        pxVar4 = (xml_attribute_struct *)0x0;
      }
      else {
        pxVar4->prev_attribute_c = (xml_attribute_struct *)0x0;
        pxVar4->next_attribute = (xml_attribute_struct *)0x0;
        pxVar4->name = (char_t *)0x0;
        pxVar4->value = (char_t *)0x0;
        pxVar4->header = ((long)pxVar4 - (long)local_28._attr) * 0x100;
      }
      xml_attribute::xml_attribute(&local_28,pxVar4);
      if ((xml_memory_page *)local_28._attr != (xml_memory_page *)0x0) {
        pxVar4 = attr->_attr;
        pxVar3 = pxVar4->next_attribute;
        pxVar7 = pxVar3;
        if (pxVar3 == (xml_attribute_struct *)0x0) {
          pxVar7 = this->_root->first_attribute;
        }
        pxVar7->prev_attribute_c = local_28._attr;
        (local_28._attr)->next_attribute = pxVar3;
        (local_28._attr)->prev_attribute_c = pxVar4;
        pxVar4->next_attribute = local_28._attr;
        xml_attribute::set_name(&local_28,name_);
        return (xml_attribute)local_28._attr;
      }
    }
  }
  xml_attribute::xml_attribute(&local_30);
  return (xml_attribute)local_30._attr;
}

Assistant:

PUGI_IMPL_FN xml_attribute xml_node::insert_attribute_after(const char_t* name_, const xml_attribute& attr)
	{
		if (!impl::allow_insert_attribute(type())) return xml_attribute();
		if (!attr || !impl::is_attribute_of(attr._attr, _root)) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::insert_attribute_after(a._attr, attr._attr, _root);

		a.set_name(name_);

		return a;
	}